

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.h
# Opt level: O0

Binary * __thiscall
jsonnet::internal::Allocator::clone<jsonnet::internal::Binary>(Allocator *this,Binary *ast)

{
  Binary *this_00;
  Binary *r;
  Binary *in_stack_ffffffffffffffd0;
  
  this_00 = (Binary *)operator_new(0xb0);
  Binary::Binary(in_stack_ffffffffffffffd0,this_00);
  std::__cxx11::list<jsonnet::internal::AST_*,_std::allocator<jsonnet::internal::AST_*>_>::push_back
            ((list<jsonnet::internal::AST_*,_std::allocator<jsonnet::internal::AST_*>_> *)this_00,
             (value_type *)this_00);
  return this_00;
}

Assistant:

T *clone(T *ast)
    {
        auto r = new T(*ast);
        allocated.push_back(r);
        return r;
    }